

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# woff2_dec.cc
# Opt level: O2

size_t woff2::anon_unknown_0::StoreOffsetTable
                 (uint8_t *result,size_t offset,uint32_t flavor,uint16_t num_tables)

{
  char cVar1;
  ushort uVar2;
  undefined6 in_register_0000000a;
  ushort uVar3;
  ushort uVar4;
  uint uVar5;
  
  result[offset] = (uint8_t)(flavor >> 0x18);
  result[offset + 1] = (uint8_t)(flavor >> 0x10);
  result[offset + 2] = (uint8_t)(flavor >> 8);
  result[offset + 3] = (uint8_t)flavor;
  uVar5 = (uint)CONCAT62(in_register_0000000a,num_tables);
  *(uint16_t *)(result + offset + 4) = num_tables << 8 | num_tables >> 8;
  uVar3 = 0xffff;
  do {
    cVar1 = (char)uVar3;
    uVar3 = uVar3 + 1;
  } while (uVar5 >> (cVar1 + 2U & 0x1f) != 0);
  uVar2 = (ushort)(0x10 << ((byte)uVar3 & 0x1f));
  uVar4 = (short)(uVar5 << 4) - uVar2;
  *(ushort *)(result + offset + 6) = uVar2 << 8 | uVar2 >> 8;
  *(ushort *)(result + offset + 8) = uVar3 * 0x100 | uVar3 >> 8;
  *(ushort *)(result + offset + 10) = uVar4 * 0x100 | uVar4 >> 8;
  return offset + 0xc;
}

Assistant:

size_t StoreOffsetTable(uint8_t* result, size_t offset, uint32_t flavor,
                        uint16_t num_tables) {
  offset = StoreU32(result, offset, flavor);  // sfnt version
  offset = Store16(result, offset, num_tables);  // num_tables
  unsigned max_pow2 = 0;
  while (1u << (max_pow2 + 1) <= num_tables) {
    max_pow2++;
  }
  const uint16_t output_search_range = (1u << max_pow2) << 4;
  offset = Store16(result, offset, output_search_range);  // searchRange
  offset = Store16(result, offset, max_pow2);  // entrySelector
  // rangeShift
  offset = Store16(result, offset, (num_tables << 4) - output_search_range);
  return offset;
}